

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_inference.cc
# Opt level: O0

statement_type_t tchecker::type_assign(expression_type_t ltype,expression_type_t rtype)

{
  bool bVar1;
  expression_type_t rtype_local;
  expression_type_t ltype_local;
  
  bVar1 = integer_assignable(ltype);
  if ((bVar1) && (bVar1 = integer_valued(rtype), bVar1)) {
    rtype_local = EXPR_TYPE_INTVAR;
  }
  else {
    bVar1 = clock_assignable(ltype);
    if ((bVar1) && (bVar1 = integer_valued(rtype), bVar1)) {
      rtype_local = EXPR_TYPE_INTARRAY;
    }
    else {
      bVar1 = clock_assignable(ltype);
      if ((bVar1) && (bVar1 = clock_valued(rtype), bVar1)) {
        rtype_local = EXPR_TYPE_LOCALINTVAR;
      }
      else {
        bVar1 = clock_assignable(ltype);
        if ((bVar1) && (rtype == EXPR_TYPE_INTCLKSUM)) {
          rtype_local = EXPR_TYPE_LOCALINTARRAY;
        }
        else {
          rtype_local = EXPR_TYPE_BAD;
        }
      }
    }
  }
  return rtype_local;
}

Assistant:

enum tchecker::statement_type_t type_assign(enum tchecker::expression_type_t ltype, enum tchecker::expression_type_t rtype)
{
  if (integer_assignable(ltype) && integer_valued(rtype))
    return tchecker::STMT_TYPE_INTASSIGN;

  if (clock_assignable(ltype) && integer_valued(rtype))
    return tchecker::STMT_TYPE_CLKASSIGN_INT;

  if (clock_assignable(ltype) && clock_valued(rtype))
    return tchecker::STMT_TYPE_CLKASSIGN_CLK;

  if (clock_assignable(ltype) && (rtype == tchecker::EXPR_TYPE_INTCLKSUM))
    return tchecker::STMT_TYPE_CLKASSIGN_SUM;

  return tchecker::STMT_TYPE_BAD;
}